

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  bool bVar30;
  uint uVar31;
  undefined4 uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  size_t sVar38;
  size_t sVar39;
  uint uVar40;
  NodeRef *pNVar41;
  NodeRef root;
  size_t i_1;
  long lVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  undefined1 in_ZMM0 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  undefined1 auVar73 [64];
  float fVar78;
  float fVar79;
  float fVar101;
  float fVar102;
  undefined1 auVar80 [16];
  float fVar103;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar121;
  float fVar123;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar125;
  undefined1 auVar109 [16];
  float fVar105;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar122;
  float fVar124;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar156;
  float fVar157;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar158;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar174;
  float fVar175;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar184;
  float fVar185;
  undefined1 auVar178 [16];
  float fVar186;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar194;
  float fVar195;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar200 [16];
  float fVar213;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar209;
  float fVar211;
  float fVar214;
  undefined1 auVar203 [16];
  float fVar212;
  float fVar215;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar208;
  float fVar210;
  undefined1 auVar207 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  float fVar224;
  float fVar226;
  float fVar227;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar225;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar230 [16];
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar235 [16];
  float local_1b28;
  float fStack_1b24;
  float fStack_1b20;
  Precalculations pre;
  undefined1 local_1ad8 [8];
  float fStack_1ad0;
  float fStack_1acc;
  RTCFilterFunctionNArguments args;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  undefined1 local_1a88 [16];
  RayK<4> *local_1a70;
  undefined1 local_1a68 [16];
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  vbool<4> terminated;
  undefined1 local_1a38 [16];
  undefined1 local_1a28 [16];
  undefined1 local_19a8 [8];
  float fStack_19a0;
  float fStack_199c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1948;
  undefined1 local_1918 [16];
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  uint local_18d8;
  uint uStack_18d4;
  uint uStack_18d0;
  uint uStack_18cc;
  uint uStack_18c8;
  uint uStack_18c4;
  uint uStack_18c0;
  uint uStack_18bc;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar29 = mm_lookupmask_ps._248_8_;
  uVar28 = mm_lookupmask_ps._240_8_;
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar100 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar106 = vpcmpeqd_avx(auVar100,(undefined1  [16])valid_i->field_0);
    auVar111 = ZEXT816(0) << 0x40;
    auVar13 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar111,5);
    auVar71 = auVar106 & auVar13;
    if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0')
    {
      auVar13 = vandps_avx(auVar13,auVar106);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar178._8_4_ = 0x7fffffff;
      auVar178._0_8_ = 0x7fffffff7fffffff;
      auVar178._12_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar188._8_4_ = 0x219392ef;
      auVar188._0_8_ = 0x219392ef219392ef;
      auVar188._12_4_ = 0x219392ef;
      auVar71 = vcmpps_avx(auVar106,auVar188,1);
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = 0x3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      auVar159 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar106 = vandps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar112 = vcmpps_avx(auVar106,auVar188,1);
      auVar160 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar106 = vandps_avx(auVar178,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar106 = vcmpps_avx(auVar106,auVar188,1);
      auVar189._8_4_ = 0x5d5e0b6b;
      auVar189._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar189._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar159,auVar189,auVar71)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar160,auVar189,auVar112);
      auVar71 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar71,auVar189,auVar106)
      ;
      auVar106 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar111,1);
      auVar159._8_4_ = 0x10;
      auVar159._0_8_ = 0x1000000010;
      auVar159._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar106,auVar159);
      auVar106 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar111,5);
      auVar71._8_4_ = 0x20;
      auVar71._0_8_ = 0x2000000020;
      auVar71._12_4_ = 0x20;
      auVar160._8_4_ = 0x30;
      auVar160._0_8_ = 0x3000000030;
      auVar160._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar160,auVar71,auVar106);
      auVar106 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar111,5);
      auVar112._8_4_ = 0x40;
      auVar112._0_8_ = 0x4000000040;
      auVar112._12_4_ = 0x40;
      auVar161._8_4_ = 0x50;
      auVar161._0_8_ = 0x5000000050;
      auVar161._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar161,auVar112,auVar106);
      auVar106 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar111);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar111);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar219 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar106,auVar13);
      auVar73 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar106,auVar71,auVar13);
      terminated.field_0.i[1] = auVar13._4_4_ ^ auVar100._4_4_;
      terminated.field_0.i[0] = auVar13._0_4_ ^ auVar100._0_4_;
      terminated.field_0.i[2] = auVar13._8_4_ ^ auVar100._8_4_;
      terminated.field_0.i[3] = auVar13._12_4_ ^ auVar100._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 3;
      }
      else {
        uVar40 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1a70 = ray + 0x80;
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_00ebfee9:
      do {
        do {
          root.ptr = pNVar41[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec14e7;
          pNVar41 = pNVar41 + -1;
          paVar37 = paVar37 + -1;
          aVar225 = *paVar37;
          auVar100 = vcmpps_avx((undefined1  [16])aVar225,(undefined1  [16])tray.tfar.field_0,1);
          uVar31 = vmovmskps_avx(auVar100);
        } while (uVar31 == 0);
        uVar43 = (ulong)(byte)uVar31;
        if (uVar40 < (uint)POPCOUNT(uVar31 & 0xff)) {
LAB_00ebff29:
          iVar33 = 4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec14e7;
              auVar100 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar225,6)
              ;
              if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar100[0xf]) goto LAB_00ebfee9;
              auVar100 = vpcmpeqd_avx(auVar100,auVar100);
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar35 = 0;
              local_1a38 = auVar100 ^ (undefined1  [16])terminated.field_0;
              goto LAB_00ec0118;
            }
            sVar39 = 8;
            aVar225 = auVar219._0_16_;
            for (lVar36 = 0;
                (lVar36 != 4 &&
                (sVar5 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar36 * 8), sVar5 != 8));
                lVar36 = lVar36 + 1) {
              uVar32 = *(undefined4 *)(root.ptr + 0x20 + lVar36 * 4);
              auVar44._4_4_ = uVar32;
              auVar44._0_4_ = uVar32;
              auVar44._8_4_ = uVar32;
              auVar44._12_4_ = uVar32;
              auVar16._8_8_ = tray.org.field_0._8_8_;
              auVar16._0_8_ = tray.org.field_0._0_8_;
              auVar17._8_8_ = tray.org.field_0._24_8_;
              auVar17._0_8_ = tray.org.field_0._16_8_;
              auVar18._8_8_ = tray.org.field_0._40_8_;
              auVar18._0_8_ = tray.org.field_0._32_8_;
              auVar100 = vsubps_avx(auVar44,auVar16);
              auVar142._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar100._0_4_;
              auVar142._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar100._4_4_;
              auVar142._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar100._8_4_;
              auVar142._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar100._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x40 + lVar36 * 4);
              auVar45._4_4_ = uVar32;
              auVar45._0_4_ = uVar32;
              auVar45._8_4_ = uVar32;
              auVar45._12_4_ = uVar32;
              auVar100 = vsubps_avx(auVar45,auVar17);
              auVar170._0_4_ = tray.rdir.field_0._16_4_ * auVar100._0_4_;
              auVar170._4_4_ = tray.rdir.field_0._20_4_ * auVar100._4_4_;
              auVar170._8_4_ = tray.rdir.field_0._24_4_ * auVar100._8_4_;
              auVar170._12_4_ = tray.rdir.field_0._28_4_ * auVar100._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x60 + lVar36 * 4);
              auVar46._4_4_ = uVar32;
              auVar46._0_4_ = uVar32;
              auVar46._8_4_ = uVar32;
              auVar46._12_4_ = uVar32;
              auVar100 = vsubps_avx(auVar46,auVar18);
              auVar190._0_4_ = tray.rdir.field_0._32_4_ * auVar100._0_4_;
              auVar190._4_4_ = tray.rdir.field_0._36_4_ * auVar100._4_4_;
              auVar190._8_4_ = tray.rdir.field_0._40_4_ * auVar100._8_4_;
              auVar190._12_4_ = tray.rdir.field_0._44_4_ * auVar100._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x30 + lVar36 * 4);
              auVar47._4_4_ = uVar32;
              auVar47._0_4_ = uVar32;
              auVar47._8_4_ = uVar32;
              auVar47._12_4_ = uVar32;
              auVar100 = vsubps_avx(auVar47,auVar16);
              auVar57._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar100._0_4_;
              auVar57._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar100._4_4_;
              auVar57._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar100._8_4_;
              auVar57._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar100._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x50 + lVar36 * 4);
              auVar48._4_4_ = uVar32;
              auVar48._0_4_ = uVar32;
              auVar48._8_4_ = uVar32;
              auVar48._12_4_ = uVar32;
              auVar100 = vsubps_avx(auVar48,auVar17);
              auVar80._0_4_ = tray.rdir.field_0._16_4_ * auVar100._0_4_;
              auVar80._4_4_ = tray.rdir.field_0._20_4_ * auVar100._4_4_;
              auVar80._8_4_ = tray.rdir.field_0._24_4_ * auVar100._8_4_;
              auVar80._12_4_ = tray.rdir.field_0._28_4_ * auVar100._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x70 + lVar36 * 4);
              auVar49._4_4_ = uVar32;
              auVar49._0_4_ = uVar32;
              auVar49._8_4_ = uVar32;
              auVar49._12_4_ = uVar32;
              auVar100 = vsubps_avx(auVar49,auVar18);
              auVar107._0_4_ = tray.rdir.field_0._32_4_ * auVar100._0_4_;
              auVar107._4_4_ = tray.rdir.field_0._36_4_ * auVar100._4_4_;
              auVar107._8_4_ = tray.rdir.field_0._40_4_ * auVar100._8_4_;
              auVar107._12_4_ = tray.rdir.field_0._44_4_ * auVar100._12_4_;
              auVar100 = vminps_avx(auVar142,auVar57);
              auVar106 = vminps_avx(auVar170,auVar80);
              auVar100 = vmaxps_avx(auVar100,auVar106);
              auVar106 = vminps_avx(auVar190,auVar107);
              auVar100 = vmaxps_avx(auVar100,auVar106);
              auVar50._0_4_ = auVar207._0_4_ * auVar100._0_4_;
              auVar50._4_4_ = auVar207._4_4_ * auVar100._4_4_;
              auVar50._8_4_ = auVar207._8_4_ * auVar100._8_4_;
              auVar50._12_4_ = auVar207._12_4_ * auVar100._12_4_;
              auVar100 = vmaxps_avx(auVar142,auVar57);
              auVar106 = vmaxps_avx(auVar170,auVar80);
              auVar106 = vminps_avx(auVar100,auVar106);
              auVar100 = vmaxps_avx(auVar190,auVar107);
              auVar100 = vminps_avx(auVar106,auVar100);
              auVar58._0_4_ = auVar223._0_4_ * auVar100._0_4_;
              auVar58._4_4_ = auVar223._4_4_ * auVar100._4_4_;
              auVar58._8_4_ = auVar223._8_4_ * auVar100._8_4_;
              auVar58._12_4_ = auVar223._12_4_ * auVar100._12_4_;
              auVar100 = vmaxps_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
              auVar106 = vminps_avx(auVar58,(undefined1  [16])tray.tfar.field_0);
              auVar100 = vcmpps_avx(auVar100,auVar106,2);
              auVar73 = ZEXT1664(auVar100);
              sVar38 = sVar39;
              aVar12 = aVar225;
              if (((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar100[0xf] < '\0') &&
                 (aVar12.v = (__m128)vblendvps_avx(auVar219._0_16_,auVar50,auVar100), sVar38 = sVar5
                 , sVar39 != 8)) {
                pNVar41->ptr = sVar39;
                pNVar41 = pNVar41 + 1;
                *paVar37 = aVar225;
                paVar37 = paVar37 + 1;
              }
              aVar225 = aVar12;
              sVar39 = sVar38;
            }
            if (sVar39 == 8) goto LAB_00ec00af;
            auVar100 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar225,6);
            uVar32 = vmovmskps_avx(auVar100);
            root.ptr = sVar39;
          } while ((byte)uVar40 < (byte)POPCOUNT(uVar32));
          pNVar41->ptr = sVar39;
          pNVar41 = pNVar41 + 1;
          *paVar37 = aVar225;
          paVar37 = paVar37 + 1;
        }
        else {
          while (uVar43 != 0) {
            sVar39 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> sVar39 & 1) == 0; sVar39 = sVar39 + 1) {
              }
            }
            uVar43 = uVar43 & uVar43 - 1;
            auVar73 = ZEXT1664(auVar73._0_16_);
            bVar30 = occluded1(This,bvh,root,sVar39,&pre,ray,&tray,context);
            if (bVar30) {
              *(undefined4 *)(local_1a38 + sVar39 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar100 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar33 = 3;
          auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar100[0xf] < '\0') {
            auVar73 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar100._8_4_ = 0xff800000;
            auVar100._0_8_ = 0xff800000ff800000;
            auVar100._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar100,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          if (uVar40 < (uint)POPCOUNT(uVar31 & 0xff)) goto LAB_00ebff29;
        }
LAB_00ec00af:
      } while (iVar33 != 3);
LAB_00ec14e7:
      auVar13 = vandps_avx(auVar13,(undefined1  [16])terminated.field_0);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      auVar13 = vmaskmovps_avx(auVar13,auVar72);
      *(undefined1 (*) [16])local_1a70 = auVar13;
    }
  }
  return;
LAB_00ec0118:
  do {
    auVar100 = auVar73._0_16_;
    if (lVar35 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar34 = lVar35 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar73 = ZEXT1664(local_1a38);
    lVar42 = 0;
    do {
      auVar106 = auVar73._0_16_;
      if (lVar42 == 4) break;
      uVar31 = *(uint *)(lVar36 + lVar42 * 4);
      if ((ulong)uVar31 == 0xffffffff) break;
      uVar32 = *(undefined4 *)(lVar36 + -0xc0 + lVar42 * 4);
      auVar230._4_4_ = uVar32;
      auVar230._0_4_ = uVar32;
      auVar230._8_4_ = uVar32;
      auVar230._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar36 + -0xb0 + lVar42 * 4);
      auVar191._4_4_ = uVar32;
      auVar191._0_4_ = uVar32;
      auVar191._8_4_ = uVar32;
      auVar191._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar36 + -0xa0 + lVar42 * 4);
      auVar108._4_4_ = uVar32;
      auVar108._0_4_ = uVar32;
      auVar108._8_4_ = uVar32;
      auVar108._12_4_ = uVar32;
      local_1a58 = *(float *)(lVar36 + -0x90 + lVar42 * 4);
      local_1a68._4_4_ = *(undefined4 *)(lVar36 + -0x80 + lVar42 * 4);
      local_1a68._0_4_ = local_1a68._4_4_;
      local_1a68._8_4_ = local_1a68._4_4_;
      local_1a68._12_4_ = local_1a68._4_4_;
      local_1a28._4_4_ = *(undefined4 *)(lVar36 + -0x70 + lVar42 * 4);
      local_1a28._0_4_ = local_1a28._4_4_;
      local_1a28._8_4_ = local_1a28._4_4_;
      local_1a28._12_4_ = local_1a28._4_4_;
      uVar32 = *(undefined4 *)(lVar36 + -0x60 + lVar42 * 4);
      uVar1 = *(undefined4 *)(lVar36 + -0x50 + lVar42 * 4);
      uVar2 = *(undefined4 *)(lVar36 + -0x40 + lVar42 * 4);
      uVar3 = *(undefined4 *)(lVar36 + -0x30 + lVar42 * 4);
      auVar220._4_4_ = uVar3;
      auVar220._0_4_ = uVar3;
      auVar220._8_4_ = uVar3;
      auVar220._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(lVar36 + -0x20 + lVar42 * 4);
      auVar143._4_4_ = uVar3;
      auVar143._0_4_ = uVar3;
      auVar143._8_4_ = uVar3;
      auVar143._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(lVar36 + -0x10 + lVar42 * 4);
      auVar171._4_4_ = uVar3;
      auVar171._0_4_ = uVar3;
      auVar171._8_4_ = uVar3;
      auVar171._12_4_ = uVar3;
      local_18b8 = *(undefined8 *)(lVar34 + 0xd0);
      uStack_18b0 = *(undefined8 *)(lVar34 + 0xd8);
      auVar100 = *(undefined1 (*) [16])(ray + 0x10);
      auVar71 = *(undefined1 (*) [16])(ray + 0x20);
      auVar159 = vsubps_avx(auVar191,auVar100);
      auVar160 = vsubps_avx(auVar108,auVar71);
      auVar161 = vsubps_avx(auVar143,auVar100);
      auVar178 = vsubps_avx(auVar171,auVar71);
      auVar111 = vsubps_avx(auVar161,auVar159);
      auVar112 = vsubps_avx(auVar178,auVar160);
      fVar8 = auVar159._0_4_;
      fVar169 = auVar161._0_4_ + fVar8;
      fVar10 = auVar159._4_4_;
      fVar174 = auVar161._4_4_ + fVar10;
      fVar77 = auVar159._8_4_;
      fVar175 = auVar161._8_4_ + fVar77;
      fVar124 = auVar159._12_4_;
      fVar176 = auVar161._12_4_ + fVar124;
      fVar9 = auVar160._0_4_;
      fVar177 = auVar178._0_4_ + fVar9;
      fVar75 = auVar160._4_4_;
      fVar184 = auVar178._4_4_ + fVar75;
      fVar122 = auVar160._8_4_;
      fVar185 = auVar178._8_4_ + fVar122;
      fVar11 = auVar160._12_4_;
      fVar186 = auVar178._12_4_ + fVar11;
      fVar56 = auVar112._0_4_;
      auVar144._0_4_ = fVar169 * fVar56;
      fVar76 = auVar112._4_4_;
      auVar144._4_4_ = fVar174 * fVar76;
      fVar212 = auVar112._8_4_;
      auVar144._8_4_ = fVar175 * fVar212;
      fVar54 = auVar112._12_4_;
      auVar144._12_4_ = fVar176 * fVar54;
      fVar74 = auVar111._0_4_;
      auVar200._0_4_ = fVar177 * fVar74;
      fVar199 = auVar111._4_4_;
      auVar200._4_4_ = fVar184 * fVar199;
      fVar215 = auVar111._8_4_;
      auVar200._8_4_ = fVar185 * fVar215;
      fVar55 = auVar111._12_4_;
      auVar200._12_4_ = fVar186 * fVar55;
      auVar188 = vsubps_avx(auVar200,auVar144);
      auVar111 = *(undefined1 (*) [16])ray;
      auVar189 = vsubps_avx(auVar230,auVar111);
      auVar216 = vsubps_avx(auVar220,auVar111);
      auVar112 = vsubps_avx(auVar216,auVar189);
      fVar187 = auVar112._0_4_;
      auVar179._0_4_ = fVar187 * fVar177;
      fVar194 = auVar112._4_4_;
      auVar179._4_4_ = fVar194 * fVar184;
      fVar195 = auVar112._8_4_;
      auVar179._8_4_ = fVar195 * fVar185;
      fVar196 = auVar112._12_4_;
      auVar179._12_4_ = fVar196 * fVar186;
      fVar177 = auVar189._0_4_;
      fVar197 = auVar216._0_4_ + fVar177;
      fVar184 = auVar189._4_4_;
      fVar208 = auVar216._4_4_ + fVar184;
      fVar185 = auVar189._8_4_;
      fVar210 = auVar216._8_4_ + fVar185;
      fVar186 = auVar189._12_4_;
      fVar213 = auVar216._12_4_ + fVar186;
      auVar221._0_4_ = fVar197 * fVar56;
      auVar221._4_4_ = fVar208 * fVar76;
      auVar221._8_4_ = fVar210 * fVar212;
      auVar221._12_4_ = fVar213 * fVar54;
      auVar14 = vsubps_avx(auVar221,auVar179);
      auVar180._0_4_ = fVar197 * fVar74;
      auVar180._4_4_ = fVar208 * fVar199;
      auVar180._8_4_ = fVar210 * fVar215;
      auVar180._12_4_ = fVar213 * fVar55;
      auVar172._0_4_ = fVar187 * fVar169;
      auVar172._4_4_ = fVar194 * fVar174;
      auVar172._8_4_ = fVar195 * fVar175;
      auVar172._12_4_ = fVar196 * fVar176;
      auVar51 = vsubps_avx(auVar172,auVar180);
      auVar112 = *(undefined1 (*) [16])(ray + 0x60);
      fVar229 = auVar112._0_4_;
      fVar231 = auVar112._4_4_;
      fVar232 = auVar112._8_4_;
      fVar233 = auVar112._12_4_;
      fVar197 = *(float *)(ray + 0x50);
      fVar208 = *(float *)(ray + 0x54);
      fVar210 = *(float *)(ray + 0x58);
      auVar25 = *(undefined1 (*) [12])(ray + 0x50);
      fVar213 = *(float *)(ray + 0x5c);
      auVar24 = *(undefined1 (*) [12])(ray + 0x40);
      fVar79 = *(float *)(ray + 0x4c);
      auVar222._0_4_ =
           auVar188._0_4_ * *(float *)(ray + 0x40) +
           fVar197 * auVar14._0_4_ + fVar229 * auVar51._0_4_;
      auVar222._4_4_ =
           auVar188._4_4_ * *(float *)(ray + 0x44) +
           fVar208 * auVar14._4_4_ + fVar231 * auVar51._4_4_;
      auVar222._8_4_ =
           auVar188._8_4_ * *(float *)(ray + 0x48) +
           fVar210 * auVar14._8_4_ + fVar232 * auVar51._8_4_;
      auVar222._12_4_ =
           auVar188._12_4_ * fVar79 + fVar213 * auVar14._12_4_ + fVar233 * auVar51._12_4_;
      auVar100 = vsubps_avx(local_1a68,auVar100);
      auVar71 = vsubps_avx(local_1a28,auVar71);
      auVar112 = vsubps_avx(auVar159,auVar100);
      auVar159 = vsubps_avx(auVar160,auVar71);
      fVar126 = fVar8 + auVar100._0_4_;
      fVar138 = fVar10 + auVar100._4_4_;
      fVar139 = fVar77 + auVar100._8_4_;
      fVar140 = fVar124 + auVar100._12_4_;
      fVar104 = fVar9 + auVar71._0_4_;
      fVar121 = fVar75 + auVar71._4_4_;
      fVar123 = fVar122 + auVar71._8_4_;
      fVar125 = fVar11 + auVar71._12_4_;
      fVar169 = auVar159._0_4_;
      auVar162._0_4_ = fVar126 * fVar169;
      fVar174 = auVar159._4_4_;
      auVar162._4_4_ = fVar138 * fVar174;
      fVar175 = auVar159._8_4_;
      auVar162._8_4_ = fVar139 * fVar175;
      fVar176 = auVar159._12_4_;
      auVar162._12_4_ = fVar140 * fVar176;
      fVar224 = auVar112._0_4_;
      auVar181._0_4_ = fVar224 * fVar104;
      fVar226 = auVar112._4_4_;
      auVar181._4_4_ = fVar226 * fVar121;
      fVar227 = auVar112._8_4_;
      auVar181._8_4_ = fVar227 * fVar123;
      fVar228 = auVar112._12_4_;
      auVar181._12_4_ = fVar228 * fVar125;
      auVar112 = vsubps_avx(auVar181,auVar162);
      auVar14._4_4_ = local_1a58;
      auVar14._0_4_ = local_1a58;
      auVar14._8_4_ = local_1a58;
      auVar14._12_4_ = local_1a58;
      auVar111 = vsubps_avx(auVar14,auVar111);
      auVar159 = vsubps_avx(auVar189,auVar111);
      fVar234 = auVar159._0_4_;
      auVar109._0_4_ = fVar234 * fVar104;
      fVar236 = auVar159._4_4_;
      auVar109._4_4_ = fVar236 * fVar121;
      fVar237 = auVar159._8_4_;
      auVar109._8_4_ = fVar237 * fVar123;
      fVar238 = auVar159._12_4_;
      auVar109._12_4_ = fVar238 * fVar125;
      fVar104 = auVar111._0_4_ + fVar177;
      fVar121 = auVar111._4_4_ + fVar184;
      fVar123 = auVar111._8_4_ + fVar185;
      fVar125 = auVar111._12_4_ + fVar186;
      auVar201._0_4_ = fVar104 * fVar169;
      auVar201._4_4_ = fVar121 * fVar174;
      auVar201._8_4_ = fVar123 * fVar175;
      auVar201._12_4_ = fVar125 * fVar176;
      auVar159 = vsubps_avx(auVar201,auVar109);
      auVar202._0_4_ = fVar104 * fVar224;
      auVar202._4_4_ = fVar121 * fVar226;
      auVar202._8_4_ = fVar123 * fVar227;
      auVar202._12_4_ = fVar125 * fVar228;
      auVar51._0_4_ = fVar234 * fVar126;
      auVar51._4_4_ = fVar236 * fVar138;
      auVar51._8_4_ = fVar237 * fVar139;
      auVar51._12_4_ = fVar238 * fVar140;
      auVar160 = vsubps_avx(auVar51,auVar202);
      local_1ad8._0_4_ = auVar24._0_4_;
      local_1ad8._4_4_ = auVar24._4_4_;
      fStack_1ad0 = auVar24._8_4_;
      local_19a8._0_4_ =
           (float)local_1ad8._0_4_ * auVar112._0_4_ +
           fVar229 * auVar160._0_4_ + fVar197 * auVar159._0_4_;
      local_19a8._4_4_ =
           (float)local_1ad8._4_4_ * auVar112._4_4_ +
           fVar231 * auVar160._4_4_ + fVar208 * auVar159._4_4_;
      fStack_19a0 = fStack_1ad0 * auVar112._8_4_ +
                    fVar232 * auVar160._8_4_ + fVar210 * auVar159._8_4_;
      fStack_199c = fVar79 * auVar112._12_4_ + fVar233 * auVar160._12_4_ + fVar213 * auVar159._12_4_
      ;
      auVar112 = vsubps_avx(auVar111,auVar216);
      fVar141 = auVar111._0_4_ + auVar216._0_4_;
      fVar156 = auVar111._4_4_ + auVar216._4_4_;
      fVar157 = auVar111._8_4_ + auVar216._8_4_;
      fVar158 = auVar111._12_4_ + auVar216._12_4_;
      auVar111 = vsubps_avx(auVar100,auVar161);
      fVar126 = auVar100._0_4_ + auVar161._0_4_;
      fVar138 = auVar100._4_4_ + auVar161._4_4_;
      fVar139 = auVar100._8_4_ + auVar161._8_4_;
      fVar140 = auVar100._12_4_ + auVar161._12_4_;
      auVar100 = vsubps_avx(auVar71,auVar178);
      fVar78 = auVar71._0_4_ + auVar178._0_4_;
      fVar101 = auVar71._4_4_ + auVar178._4_4_;
      fVar102 = auVar71._8_4_ + auVar178._8_4_;
      fVar103 = auVar71._12_4_ + auVar178._12_4_;
      fVar198 = auVar100._0_4_;
      auVar163._0_4_ = fVar198 * fVar126;
      fVar209 = auVar100._4_4_;
      auVar163._4_4_ = fVar209 * fVar138;
      fVar211 = auVar100._8_4_;
      auVar163._8_4_ = fVar211 * fVar139;
      fVar214 = auVar100._12_4_;
      auVar163._12_4_ = fVar214 * fVar140;
      fVar104 = auVar111._0_4_;
      auVar182._0_4_ = fVar104 * fVar78;
      fVar121 = auVar111._4_4_;
      auVar182._4_4_ = fVar121 * fVar101;
      fVar123 = auVar111._8_4_;
      auVar182._8_4_ = fVar123 * fVar102;
      fVar125 = auVar111._12_4_;
      auVar182._12_4_ = fVar125 * fVar103;
      auVar100 = vsubps_avx(auVar182,auVar163);
      fVar105 = auVar112._0_4_;
      auVar81._0_4_ = fVar105 * fVar78;
      fVar78 = auVar112._4_4_;
      auVar81._4_4_ = fVar78 * fVar101;
      fVar101 = auVar112._8_4_;
      auVar81._8_4_ = fVar101 * fVar102;
      fVar102 = auVar112._12_4_;
      auVar81._12_4_ = fVar102 * fVar103;
      auVar183._0_4_ = fVar198 * fVar141;
      auVar183._4_4_ = fVar209 * fVar156;
      auVar183._8_4_ = fVar211 * fVar157;
      auVar183._12_4_ = fVar214 * fVar158;
      auVar71 = vsubps_avx(auVar183,auVar81);
      auVar145._0_4_ = fVar141 * fVar104;
      auVar145._4_4_ = fVar156 * fVar121;
      auVar145._8_4_ = fVar157 * fVar123;
      auVar145._12_4_ = fVar158 * fVar125;
      auVar111._0_4_ = fVar105 * fVar126;
      auVar111._4_4_ = fVar78 * fVar138;
      auVar111._8_4_ = fVar101 * fVar139;
      auVar111._12_4_ = fVar102 * fVar140;
      auVar111 = vsubps_avx(auVar111,auVar145);
      auVar59._0_4_ =
           (float)local_1ad8._0_4_ * auVar100._0_4_ +
           fVar229 * auVar111._0_4_ + fVar197 * auVar71._0_4_;
      auVar59._4_4_ =
           (float)local_1ad8._4_4_ * auVar100._4_4_ +
           fVar231 * auVar111._4_4_ + fVar208 * auVar71._4_4_;
      auVar59._8_4_ =
           fStack_1ad0 * auVar100._8_4_ + fVar232 * auVar111._8_4_ + fVar210 * auVar71._8_4_;
      auVar59._12_4_ =
           fVar79 * auVar100._12_4_ + fVar233 * auVar111._12_4_ + fVar213 * auVar71._12_4_;
      auVar127._0_4_ = auVar59._0_4_ + auVar222._0_4_ + (float)local_19a8._0_4_;
      auVar127._4_4_ = auVar59._4_4_ + auVar222._4_4_ + (float)local_19a8._4_4_;
      auVar127._8_4_ = auVar59._8_4_ + auVar222._8_4_ + fStack_19a0;
      auVar127._12_4_ = auVar59._12_4_ + auVar222._12_4_ + fStack_199c;
      auVar100 = vminps_avx(auVar222,_local_19a8);
      auVar71 = vminps_avx(auVar100,auVar59);
      auVar146._8_4_ = 0x7fffffff;
      auVar146._0_8_ = 0x7fffffff7fffffff;
      auVar146._12_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar127,auVar146);
      auVar147._0_4_ = auVar100._0_4_ * 1.1920929e-07;
      auVar147._4_4_ = auVar100._4_4_ * 1.1920929e-07;
      auVar147._8_4_ = auVar100._8_4_ * 1.1920929e-07;
      auVar147._12_4_ = auVar100._12_4_ * 1.1920929e-07;
      uVar43 = CONCAT44(auVar147._4_4_,auVar147._0_4_);
      auVar164._0_8_ = uVar43 ^ 0x8000000080000000;
      auVar164._8_4_ = -auVar147._8_4_;
      auVar164._12_4_ = -auVar147._12_4_;
      auVar71 = vcmpps_avx(auVar71,auVar164,5);
      auVar111 = vmaxps_avx(auVar222,_local_19a8);
      auVar111 = vmaxps_avx(auVar111,auVar59);
      auVar111 = vcmpps_avx(auVar111,auVar147,2);
      auVar71 = vorps_avx(auVar71,auVar111);
      auVar111 = auVar106 & auVar71;
      fStack_1a54 = local_1a58;
      fStack_1a50 = local_1a58;
      fStack_1a4c = local_1a58;
      if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar111[0xf]
         ) {
LAB_00ec0af2:
        auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar60._0_4_ = fVar224 * fVar56;
        auVar60._4_4_ = fVar226 * fVar76;
        auVar60._8_4_ = fVar227 * fVar212;
        auVar60._12_4_ = fVar228 * fVar54;
        auVar82._0_4_ = fVar74 * fVar169;
        auVar82._4_4_ = fVar199 * fVar174;
        auVar82._8_4_ = fVar215 * fVar175;
        auVar82._12_4_ = fVar55 * fVar176;
        auVar159 = vsubps_avx(auVar82,auVar60);
        auVar148._0_4_ = fVar104 * fVar169;
        auVar148._4_4_ = fVar121 * fVar174;
        auVar148._8_4_ = fVar123 * fVar175;
        auVar148._12_4_ = fVar125 * fVar176;
        auVar165._0_4_ = fVar224 * fVar198;
        auVar165._4_4_ = fVar226 * fVar209;
        auVar165._8_4_ = fVar227 * fVar211;
        auVar165._12_4_ = fVar228 * fVar214;
        auVar160 = vsubps_avx(auVar165,auVar148);
        auVar111 = vandps_avx(auVar146,auVar60);
        auVar112 = vandps_avx(auVar146,auVar148);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        auVar61._0_4_ = fVar234 * fVar198;
        auVar61._4_4_ = fVar236 * fVar209;
        auVar61._8_4_ = fVar237 * fVar211;
        auVar61._12_4_ = fVar238 * fVar214;
        auVar83._0_4_ = fVar234 * fVar56;
        auVar83._4_4_ = fVar236 * fVar76;
        auVar83._8_4_ = fVar237 * fVar212;
        auVar83._12_4_ = fVar238 * fVar54;
        auVar149._0_4_ = fVar187 * fVar169;
        auVar149._4_4_ = fVar194 * fVar174;
        auVar149._8_4_ = fVar195 * fVar175;
        auVar149._12_4_ = fVar196 * fVar176;
        auVar159 = vsubps_avx(auVar83,auVar149);
        auVar166._0_4_ = fVar105 * fVar169;
        auVar166._4_4_ = fVar78 * fVar174;
        auVar166._8_4_ = fVar101 * fVar175;
        auVar166._12_4_ = fVar102 * fVar176;
        auVar160 = vsubps_avx(auVar166,auVar61);
        auVar111 = vandps_avx(auVar146,auVar149);
        auVar112 = vandps_avx(auVar146,auVar61);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        auVar62._0_4_ = fVar224 * fVar105;
        auVar62._4_4_ = fVar226 * fVar78;
        auVar62._8_4_ = fVar227 * fVar101;
        auVar62._12_4_ = fVar228 * fVar102;
        auVar84._0_4_ = fVar187 * fVar224;
        auVar84._4_4_ = fVar194 * fVar226;
        auVar84._8_4_ = fVar195 * fVar227;
        auVar84._12_4_ = fVar196 * fVar228;
        auVar110._0_4_ = fVar234 * fVar74;
        auVar110._4_4_ = fVar236 * fVar199;
        auVar110._8_4_ = fVar237 * fVar215;
        auVar110._12_4_ = fVar238 * fVar55;
        auVar52._0_4_ = fVar234 * fVar104;
        auVar52._4_4_ = fVar236 * fVar121;
        auVar52._8_4_ = fVar237 * fVar123;
        auVar52._12_4_ = fVar238 * fVar125;
        auVar159 = vsubps_avx(auVar84,auVar110);
        auVar160 = vsubps_avx(auVar52,auVar62);
        auVar111 = vandps_avx(auVar146,auVar110);
        auVar112 = vandps_avx(auVar146,auVar62);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        local_1a98 = auVar25._0_4_;
        fStack_1a94 = auVar25._4_4_;
        fStack_1a90 = auVar25._8_4_;
        fVar56 = local_1948._0_4_ * (float)local_1ad8._0_4_ +
                 local_1948._32_4_ * fVar229 + local_1948._16_4_ * local_1a98;
        fVar74 = local_1948._4_4_ * (float)local_1ad8._4_4_ +
                 local_1948._36_4_ * fVar231 + local_1948._20_4_ * fStack_1a94;
        fVar169 = local_1948._8_4_ * fStack_1ad0 +
                  local_1948._40_4_ * fVar232 + local_1948._24_4_ * fStack_1a90;
        fVar76 = local_1948._12_4_ * fVar79 +
                 local_1948._44_4_ * fVar233 + local_1948._28_4_ * fVar213;
        auVar85._0_4_ = fVar56 + fVar56;
        auVar85._4_4_ = fVar74 + fVar74;
        auVar85._8_4_ = fVar169 + fVar169;
        auVar85._12_4_ = fVar76 + fVar76;
        fVar56 = local_1948._0_4_ * fVar177 + local_1948._32_4_ * fVar9 + local_1948._16_4_ * fVar8;
        fVar75 = local_1948._4_4_ * fVar184 +
                 local_1948._36_4_ * fVar75 + local_1948._20_4_ * fVar10;
        fVar184 = local_1948._8_4_ * fVar185 +
                  local_1948._40_4_ * fVar122 + local_1948._24_4_ * fVar77;
        fVar77 = local_1948._12_4_ * fVar186 +
                 local_1948._44_4_ * fVar11 + local_1948._28_4_ * fVar124;
        auVar111 = vrcpps_avx(auVar85);
        fVar8 = auVar111._0_4_;
        auVar128._0_4_ = auVar85._0_4_ * fVar8;
        fVar9 = auVar111._4_4_;
        auVar128._4_4_ = auVar85._4_4_ * fVar9;
        fVar177 = auVar111._8_4_;
        auVar128._8_4_ = auVar85._8_4_ * fVar177;
        fVar10 = auVar111._12_4_;
        auVar128._12_4_ = auVar85._12_4_ * fVar10;
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar150,auVar128);
        local_1918._0_4_ = (fVar56 + fVar56) * (fVar8 + fVar8 * auVar111._0_4_);
        local_1918._4_4_ = (fVar75 + fVar75) * (fVar9 + fVar9 * auVar111._4_4_);
        local_1918._8_4_ = (fVar184 + fVar184) * (fVar177 + fVar177 * auVar111._8_4_);
        local_1918._12_4_ = (fVar77 + fVar77) * (fVar10 + fVar10 * auVar111._12_4_);
        auVar111 = vcmpps_avx(local_1918,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar112 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_1918,2);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar112 = vcmpps_avx(auVar85,ZEXT816(0) << 0x20,4);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar71 = vandps_avx(auVar106,auVar71);
        auVar111 = vpslld_avx(auVar111,0x1f);
        auVar112 = vpsrad_avx(auVar111,0x1f);
        auVar111 = auVar71 & auVar112;
        if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar111[0xf]) goto LAB_00ec0af2;
        auVar71 = vandps_avx(auVar112,auVar71);
        pGVar6 = (context->scene->geometries).items[uVar31].ptr;
        uVar4 = pGVar6->mask;
        auVar113._4_4_ = uVar4;
        auVar113._0_4_ = uVar4;
        auVar113._8_4_ = uVar4;
        auVar113._12_4_ = uVar4;
        auVar111 = vandps_avx(auVar113,*(undefined1 (*) [16])(ray + 0x90));
        auVar111 = vpcmpeqd_avx(auVar111,ZEXT816(0) << 0x20);
        auVar112 = auVar71 & ~auVar111;
        auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          uVar4 = *(uint *)((long)&local_18b8 + lVar42 * 4);
          auVar71 = vandnps_avx(auVar111,auVar71);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar111 = vrcpps_avx(auVar127);
            fVar8 = auVar111._0_4_;
            auVar118._0_4_ = auVar127._0_4_ * fVar8;
            fVar9 = auVar111._4_4_;
            auVar118._4_4_ = auVar127._4_4_ * fVar9;
            fVar177 = auVar111._8_4_;
            auVar118._8_4_ = auVar127._8_4_ * fVar177;
            fVar10 = auVar111._12_4_;
            auVar118._12_4_ = auVar127._12_4_ * fVar10;
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar111 = vsubps_avx(auVar155,auVar118);
            auVar92._0_4_ = fVar8 + fVar8 * auVar111._0_4_;
            auVar92._4_4_ = fVar9 + fVar9 * auVar111._4_4_;
            auVar92._8_4_ = fVar177 + fVar177 * auVar111._8_4_;
            auVar92._12_4_ = fVar10 + fVar10 * auVar111._12_4_;
            auVar119._8_4_ = 0x219392ef;
            auVar119._0_8_ = 0x219392ef219392ef;
            auVar119._12_4_ = 0x219392ef;
            auVar100 = vcmpps_avx(auVar100,auVar119,5);
            auVar100 = vandps_avx(auVar100,auVar92);
            auVar120._0_4_ = auVar100._0_4_ * auVar222._0_4_;
            auVar120._4_4_ = auVar100._4_4_ * auVar222._4_4_;
            auVar120._8_4_ = auVar100._8_4_ * auVar222._8_4_;
            auVar120._12_4_ = auVar100._12_4_ * auVar222._12_4_;
            auVar111 = vminps_avx(auVar120,auVar155);
            auVar93._0_4_ = (float)local_19a8._0_4_ * auVar100._0_4_;
            auVar93._4_4_ = (float)local_19a8._4_4_ * auVar100._4_4_;
            auVar93._8_4_ = fStack_19a0 * auVar100._8_4_;
            auVar93._12_4_ = fStack_199c * auVar100._12_4_;
            auVar100 = vminps_avx(auVar93,auVar155);
            auVar112 = vsubps_avx(auVar155,auVar111);
            auVar159 = vsubps_avx(auVar155,auVar100);
            auVar20._8_8_ = uVar27;
            auVar20._0_8_ = uVar26;
            local_18f8 = vblendvps_avx(auVar111,auVar112,auVar20);
            local_1908 = vblendvps_avx(auVar100,auVar159,auVar20);
            args.valid = (int *)&Ng;
            args.geometryUserPtr = &t;
            args.context = (RTCRayQueryContext *)&v;
            args.ray = (RTCRayN *)&u;
            std::
            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
            ::
            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&local_1948.field_0);
            local_18e8 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
            local_18f8 = vpshufd_avx(ZEXT416(uVar4),0);
            vcmpps_avx(ZEXT1632(local_18e8),ZEXT1632(local_18e8),0xf);
            uStack_18d4 = context->user->instID[0];
            local_18d8 = uStack_18d4;
            uStack_18d0 = uStack_18d4;
            uStack_18cc = uStack_18d4;
            uStack_18c8 = context->user->instPrimID[0];
            uStack_18c4 = uStack_18c8;
            uStack_18c0 = uStack_18c8;
            uStack_18bc = uStack_18c8;
            auVar100 = *(undefined1 (*) [16])(ray + 0x80);
            auVar111 = vblendvps_avx(auVar100,(undefined1  [16])t.field_0,auVar71);
            *(undefined1 (*) [16])(ray + 0x80) = auVar111;
            args.valid = (int *)local_1a88;
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&local_1948;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            local_1a88 = auVar71;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar6->occlusionFilterN)(&args);
            }
            if (local_1a88 == (undefined1  [16])0x0) {
              auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar71 = auVar71 ^ _DAT_01f46b70;
              auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            }
            else {
              p_Var7 = context->args->filter;
              if (p_Var7 == (RTCFilterFunctionN)0x0) {
                auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var7)(&args);
                  auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
              }
              auVar111 = vpcmpeqd_avx(local_1a88,_DAT_01f45a50);
              auVar71 = auVar111 ^ _DAT_01f46b70;
              auVar97._8_4_ = 0xff800000;
              auVar97._0_8_ = 0xff800000ff800000;
              auVar97._12_4_ = 0xff800000;
              auVar111 = vblendvps_avx(auVar97,*(undefined1 (*) [16])(args.ray + 0x80),auVar111);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
            }
            auVar111 = vpslld_avx(auVar71,0x1f);
            auVar71 = vpsrad_avx(auVar111,0x1f);
            auVar100 = vblendvps_avx(auVar100,*(undefined1 (*) [16])local_1a70,auVar111);
            *(undefined1 (*) [16])local_1a70 = auVar100;
          }
          auVar106 = vpandn_avx(auVar71,auVar106);
        }
      }
      if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar106 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar106 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar106[0xf]
         ) break;
      auVar100 = *(undefined1 (*) [16])ray;
      auVar71 = *(undefined1 (*) [16])(ray + 0x10);
      auVar111 = *(undefined1 (*) [16])(ray + 0x20);
      auVar23._4_4_ = uVar32;
      auVar23._0_4_ = uVar32;
      auVar23._8_4_ = uVar32;
      auVar23._12_4_ = uVar32;
      auVar112 = vsubps_avx(auVar23,auVar100);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar159 = vsubps_avx(auVar22,auVar71);
      auVar21._4_4_ = uVar2;
      auVar21._0_4_ = uVar2;
      auVar21._8_4_ = uVar2;
      auVar21._12_4_ = uVar2;
      auVar160 = vsubps_avx(auVar21,auVar111);
      auVar161 = vsubps_avx(auVar220,auVar100);
      auVar178 = vsubps_avx(auVar143,auVar71);
      auVar188 = vsubps_avx(auVar171,auVar111);
      auVar15._4_4_ = fStack_1a54;
      auVar15._0_4_ = local_1a58;
      auVar15._8_4_ = fStack_1a50;
      auVar15._12_4_ = fStack_1a4c;
      auVar100 = vsubps_avx(auVar15,auVar100);
      auVar71 = vsubps_avx(local_1a68,auVar71);
      auVar111 = vsubps_avx(local_1a28,auVar111);
      auVar189 = vsubps_avx(auVar100,auVar112);
      auVar216 = vsubps_avx(auVar71,auVar159);
      auVar14 = vsubps_avx(auVar111,auVar160);
      fVar8 = auVar159._0_4_;
      fVar184 = auVar71._0_4_ + fVar8;
      fVar9 = auVar159._4_4_;
      fVar122 = auVar71._4_4_ + fVar9;
      fVar177 = auVar159._8_4_;
      fVar124 = auVar71._8_4_ + fVar177;
      fVar10 = auVar159._12_4_;
      fVar186 = auVar71._12_4_ + fVar10;
      fVar228 = auVar160._0_4_;
      fVar56 = fVar228 + auVar111._0_4_;
      fVar231 = auVar160._4_4_;
      fVar74 = fVar231 + auVar111._4_4_;
      fVar233 = auVar160._8_4_;
      fVar169 = fVar233 + auVar111._8_4_;
      fVar236 = auVar160._12_4_;
      fVar76 = fVar236 + auVar111._12_4_;
      fVar75 = auVar14._0_4_;
      auVar203._0_4_ = fVar184 * fVar75;
      fVar77 = auVar14._4_4_;
      auVar203._4_4_ = fVar122 * fVar77;
      fVar185 = auVar14._8_4_;
      auVar203._8_4_ = fVar124 * fVar185;
      fVar11 = auVar14._12_4_;
      auVar203._12_4_ = fVar186 * fVar11;
      fVar196 = auVar216._0_4_;
      auVar217._0_4_ = fVar196 * fVar56;
      fVar198 = auVar216._4_4_;
      auVar217._4_4_ = fVar198 * fVar74;
      fVar209 = auVar216._8_4_;
      auVar217._8_4_ = fVar209 * fVar169;
      fVar211 = auVar216._12_4_;
      auVar217._12_4_ = fVar211 * fVar76;
      auVar216 = vsubps_avx(auVar217,auVar203);
      fVar158 = auVar112._0_4_;
      fVar199 = fVar158 + auVar100._0_4_;
      fVar187 = auVar112._4_4_;
      fVar174 = fVar187 + auVar100._4_4_;
      fVar194 = auVar112._8_4_;
      fVar212 = fVar194 + auVar100._8_4_;
      fVar195 = auVar112._12_4_;
      fVar215 = fVar195 + auVar100._12_4_;
      fVar79 = auVar189._0_4_;
      auVar173._0_4_ = fVar79 * fVar56;
      fVar121 = auVar189._4_4_;
      auVar173._4_4_ = fVar121 * fVar74;
      fVar125 = auVar189._8_4_;
      auVar173._8_4_ = fVar125 * fVar169;
      fVar138 = auVar189._12_4_;
      auVar173._12_4_ = fVar138 * fVar76;
      auVar218._0_4_ = fVar199 * fVar75;
      auVar218._4_4_ = fVar174 * fVar77;
      auVar218._8_4_ = fVar212 * fVar185;
      auVar218._12_4_ = fVar215 * fVar11;
      auVar189 = vsubps_avx(auVar218,auVar173);
      auVar204._0_4_ = fVar199 * fVar196;
      auVar204._4_4_ = fVar174 * fVar198;
      auVar204._8_4_ = fVar212 * fVar209;
      auVar204._12_4_ = fVar215 * fVar211;
      auVar114._0_4_ = fVar79 * fVar184;
      auVar114._4_4_ = fVar121 * fVar122;
      auVar114._8_4_ = fVar125 * fVar124;
      auVar114._12_4_ = fVar138 * fVar186;
      auVar14 = vsubps_avx(auVar114,auVar204);
      fVar56 = *(float *)(ray + 0x60);
      fVar74 = *(float *)(ray + 100);
      fVar169 = *(float *)(ray + 0x68);
      auVar24 = *(undefined1 (*) [12])(ray + 0x60);
      fVar76 = *(float *)(ray + 0x6c);
      local_1a58 = *(float *)(ray + 0x50);
      fStack_1a54 = *(float *)(ray + 0x54);
      fStack_1a50 = *(float *)(ray + 0x58);
      fStack_1a4c = *(float *)(ray + 0x5c);
      fVar199 = *(float *)(ray + 0x40);
      fVar174 = *(float *)(ray + 0x44);
      fVar212 = *(float *)(ray + 0x48);
      fVar215 = *(float *)(ray + 0x4c);
      local_1ad8._0_4_ =
           fVar199 * auVar216._0_4_ + fVar56 * auVar14._0_4_ + local_1a58 * auVar189._0_4_;
      local_1ad8._4_4_ =
           fVar174 * auVar216._4_4_ + fVar74 * auVar14._4_4_ + fStack_1a54 * auVar189._4_4_;
      fStack_1ad0 = fVar212 * auVar216._8_4_ +
                    fVar169 * auVar14._8_4_ + fStack_1a50 * auVar189._8_4_;
      fStack_1acc = fVar215 * auVar216._12_4_ +
                    fVar76 * auVar14._12_4_ + fStack_1a4c * auVar189._12_4_;
      auVar159 = vsubps_avx(auVar159,auVar178);
      auVar160 = vsubps_avx(auVar160,auVar188);
      fVar104 = auVar178._0_4_ + fVar8;
      fVar123 = auVar178._4_4_ + fVar9;
      fVar126 = auVar178._8_4_ + fVar177;
      fVar139 = auVar178._12_4_ + fVar10;
      fVar197 = fVar228 + auVar188._0_4_;
      fVar208 = fVar231 + auVar188._4_4_;
      fVar210 = fVar233 + auVar188._8_4_;
      fVar213 = fVar236 + auVar188._12_4_;
      fVar184 = auVar160._0_4_;
      auVar235._0_4_ = fVar104 * fVar184;
      fVar122 = auVar160._4_4_;
      auVar235._4_4_ = fVar123 * fVar122;
      fVar124 = auVar160._8_4_;
      auVar235._8_4_ = fVar126 * fVar124;
      fVar186 = auVar160._12_4_;
      auVar235._12_4_ = fVar139 * fVar186;
      fVar175 = auVar159._0_4_;
      auVar129._0_4_ = fVar175 * fVar197;
      fVar54 = auVar159._4_4_;
      auVar129._4_4_ = fVar54 * fVar208;
      fVar55 = auVar159._8_4_;
      auVar129._8_4_ = fVar55 * fVar210;
      fVar176 = auVar159._12_4_;
      auVar129._12_4_ = fVar176 * fVar213;
      auVar159 = vsubps_avx(auVar129,auVar235);
      auVar160 = vsubps_avx(auVar112,auVar161);
      fVar229 = auVar160._0_4_;
      auVar86._0_4_ = fVar229 * fVar197;
      fVar232 = auVar160._4_4_;
      auVar86._4_4_ = fVar232 * fVar208;
      fVar234 = auVar160._8_4_;
      auVar86._8_4_ = fVar234 * fVar210;
      fVar237 = auVar160._12_4_;
      auVar86._12_4_ = fVar237 * fVar213;
      fVar197 = fVar158 + auVar161._0_4_;
      fVar208 = fVar187 + auVar161._4_4_;
      fVar210 = fVar194 + auVar161._8_4_;
      fVar213 = fVar195 + auVar161._12_4_;
      auVar205._0_4_ = fVar197 * fVar184;
      auVar205._4_4_ = fVar208 * fVar122;
      auVar205._8_4_ = fVar210 * fVar124;
      auVar205._12_4_ = fVar213 * fVar186;
      auVar160 = vsubps_avx(auVar205,auVar86);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar192._0_4_ = fVar197 * fVar175;
      auVar192._4_4_ = fVar208 * fVar54;
      auVar192._8_4_ = fVar210 * fVar55;
      auVar192._12_4_ = fVar213 * fVar176;
      auVar115._0_4_ = fVar229 * fVar104;
      auVar115._4_4_ = fVar232 * fVar123;
      auVar115._8_4_ = fVar234 * fVar126;
      auVar115._12_4_ = fVar237 * fVar139;
      auVar189 = vsubps_avx(auVar115,auVar192);
      auVar193._0_4_ =
           fVar199 * auVar159._0_4_ + fVar56 * auVar189._0_4_ + local_1a58 * auVar160._0_4_;
      auVar193._4_4_ =
           fVar174 * auVar159._4_4_ + fVar74 * auVar189._4_4_ + fStack_1a54 * auVar160._4_4_;
      auVar193._8_4_ =
           fVar212 * auVar159._8_4_ + fVar169 * auVar189._8_4_ + fStack_1a50 * auVar160._8_4_;
      auVar193._12_4_ =
           fVar215 * auVar159._12_4_ + fVar76 * auVar189._12_4_ + fStack_1a4c * auVar160._12_4_;
      auVar159 = vsubps_avx(auVar161,auVar100);
      fVar197 = auVar161._0_4_ + auVar100._0_4_;
      fVar208 = auVar161._4_4_ + auVar100._4_4_;
      fVar210 = auVar161._8_4_ + auVar100._8_4_;
      fVar213 = auVar161._12_4_ + auVar100._12_4_;
      auVar100 = vsubps_avx(auVar178,auVar71);
      fVar104 = auVar178._0_4_ + auVar71._0_4_;
      fVar123 = auVar178._4_4_ + auVar71._4_4_;
      fVar126 = auVar178._8_4_ + auVar71._8_4_;
      fVar139 = auVar178._12_4_ + auVar71._12_4_;
      auVar71 = vsubps_avx(auVar188,auVar111);
      fVar78 = auVar188._0_4_ + auVar111._0_4_;
      fVar101 = auVar188._4_4_ + auVar111._4_4_;
      fVar102 = auVar188._8_4_ + auVar111._8_4_;
      fVar103 = auVar188._12_4_ + auVar111._12_4_;
      fVar214 = auVar71._0_4_;
      auVar151._0_4_ = fVar214 * fVar104;
      fVar224 = auVar71._4_4_;
      auVar151._4_4_ = fVar224 * fVar123;
      fVar226 = auVar71._8_4_;
      auVar151._8_4_ = fVar226 * fVar126;
      fVar227 = auVar71._12_4_;
      auVar151._12_4_ = fVar227 * fVar139;
      fVar105 = auVar100._0_4_;
      auVar167._0_4_ = fVar105 * fVar78;
      fVar141 = auVar100._4_4_;
      auVar167._4_4_ = fVar141 * fVar101;
      fVar156 = auVar100._8_4_;
      auVar167._8_4_ = fVar156 * fVar102;
      fVar157 = auVar100._12_4_;
      auVar167._12_4_ = fVar157 * fVar103;
      auVar100 = vsubps_avx(auVar167,auVar151);
      fVar140 = auVar159._0_4_;
      auVar130._0_4_ = fVar140 * fVar78;
      fVar78 = auVar159._4_4_;
      auVar130._4_4_ = fVar78 * fVar101;
      fVar101 = auVar159._8_4_;
      auVar130._8_4_ = fVar101 * fVar102;
      fVar102 = auVar159._12_4_;
      auVar130._12_4_ = fVar102 * fVar103;
      auVar168._0_4_ = fVar214 * fVar197;
      auVar168._4_4_ = fVar224 * fVar208;
      auVar168._8_4_ = fVar226 * fVar210;
      auVar168._12_4_ = fVar227 * fVar213;
      auVar71 = vsubps_avx(auVar168,auVar130);
      auVar63._0_4_ = fVar105 * fVar197;
      auVar63._4_4_ = fVar141 * fVar208;
      auVar63._8_4_ = fVar156 * fVar210;
      auVar63._12_4_ = fVar157 * fVar213;
      auVar87._0_4_ = fVar140 * fVar104;
      auVar87._4_4_ = fVar78 * fVar123;
      auVar87._8_4_ = fVar101 * fVar126;
      auVar87._12_4_ = fVar102 * fVar139;
      auVar111 = vsubps_avx(auVar87,auVar63);
      auVar64._0_4_ =
           fVar199 * auVar100._0_4_ + fVar56 * auVar111._0_4_ + local_1a58 * auVar71._0_4_;
      auVar64._4_4_ =
           fVar174 * auVar100._4_4_ + fVar74 * auVar111._4_4_ + fStack_1a54 * auVar71._4_4_;
      auVar64._8_4_ =
           fVar212 * auVar100._8_4_ + fVar169 * auVar111._8_4_ + fStack_1a50 * auVar71._8_4_;
      auVar64._12_4_ =
           fVar215 * auVar100._12_4_ + fVar76 * auVar111._12_4_ + fStack_1a4c * auVar71._12_4_;
      auVar131._0_4_ = auVar64._0_4_ + auVar193._0_4_ + (float)local_1ad8._0_4_;
      auVar131._4_4_ = auVar64._4_4_ + auVar193._4_4_ + (float)local_1ad8._4_4_;
      auVar131._8_4_ = auVar64._8_4_ + auVar193._8_4_ + fStack_1ad0;
      auVar131._12_4_ = auVar64._12_4_ + auVar193._12_4_ + fStack_1acc;
      auVar100 = vminps_avx(_local_1ad8,auVar193);
      auVar71 = vminps_avx(auVar100,auVar64);
      auVar100 = vandps_avx(auVar206,auVar131);
      auVar132._0_4_ = auVar100._0_4_ * 1.1920929e-07;
      auVar132._4_4_ = auVar100._4_4_ * 1.1920929e-07;
      auVar132._8_4_ = auVar100._8_4_ * 1.1920929e-07;
      auVar132._12_4_ = auVar100._12_4_ * 1.1920929e-07;
      uVar43 = CONCAT44(auVar132._4_4_,auVar132._0_4_);
      auVar152._0_8_ = uVar43 ^ 0x8000000080000000;
      auVar152._8_4_ = -auVar132._8_4_;
      auVar152._12_4_ = -auVar132._12_4_;
      auVar71 = vcmpps_avx(auVar71,auVar152,5);
      auVar111 = vmaxps_avx(_local_1ad8,auVar193);
      auVar111 = vmaxps_avx(auVar111,auVar64);
      auVar111 = vcmpps_avx(auVar111,auVar132,2);
      auVar71 = vorps_avx(auVar71,auVar111);
      auVar111 = auVar106 & auVar71;
      local_1a68 = auVar112;
      if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar111[0xf]
         ) {
        auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar73 = ZEXT1664(auVar106);
      }
      else {
        auVar65._0_4_ = fVar175 * fVar75;
        auVar65._4_4_ = fVar54 * fVar77;
        auVar65._8_4_ = fVar55 * fVar185;
        auVar65._12_4_ = fVar176 * fVar11;
        auVar88._0_4_ = fVar196 * fVar184;
        auVar88._4_4_ = fVar198 * fVar122;
        auVar88._8_4_ = fVar209 * fVar124;
        auVar88._12_4_ = fVar211 * fVar186;
        auVar159 = vsubps_avx(auVar88,auVar65);
        auVar133._0_4_ = fVar105 * fVar184;
        auVar133._4_4_ = fVar141 * fVar122;
        auVar133._8_4_ = fVar156 * fVar124;
        auVar133._12_4_ = fVar157 * fVar186;
        auVar153._0_4_ = fVar175 * fVar214;
        auVar153._4_4_ = fVar54 * fVar224;
        auVar153._8_4_ = fVar55 * fVar226;
        auVar153._12_4_ = fVar176 * fVar227;
        auVar160 = vsubps_avx(auVar153,auVar133);
        auVar111 = vandps_avx(auVar65,auVar206);
        auVar112 = vandps_avx(auVar133,auVar206);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        auVar66._0_4_ = fVar229 * fVar214;
        auVar66._4_4_ = fVar232 * fVar224;
        auVar66._8_4_ = fVar234 * fVar226;
        auVar66._12_4_ = fVar237 * fVar227;
        auVar89._0_4_ = fVar229 * fVar75;
        auVar89._4_4_ = fVar232 * fVar77;
        auVar89._8_4_ = fVar234 * fVar185;
        auVar89._12_4_ = fVar237 * fVar11;
        auVar134._0_4_ = fVar79 * fVar184;
        auVar134._4_4_ = fVar121 * fVar122;
        auVar134._8_4_ = fVar125 * fVar124;
        auVar134._12_4_ = fVar138 * fVar186;
        auVar159 = vsubps_avx(auVar89,auVar134);
        auVar154._0_4_ = fVar140 * fVar184;
        auVar154._4_4_ = fVar78 * fVar122;
        auVar154._8_4_ = fVar101 * fVar124;
        auVar154._12_4_ = fVar102 * fVar186;
        auVar160 = vsubps_avx(auVar154,auVar66);
        auVar111 = vandps_avx(auVar134,auVar206);
        auVar112 = vandps_avx(auVar66,auVar206);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        auVar67._0_4_ = fVar175 * fVar140;
        auVar67._4_4_ = fVar54 * fVar78;
        auVar67._8_4_ = fVar55 * fVar101;
        auVar67._12_4_ = fVar176 * fVar102;
        auVar90._0_4_ = fVar79 * fVar175;
        auVar90._4_4_ = fVar121 * fVar54;
        auVar90._8_4_ = fVar125 * fVar55;
        auVar90._12_4_ = fVar138 * fVar176;
        auVar116._0_4_ = fVar229 * fVar196;
        auVar116._4_4_ = fVar232 * fVar198;
        auVar116._8_4_ = fVar234 * fVar209;
        auVar116._12_4_ = fVar237 * fVar211;
        auVar135._0_4_ = fVar229 * fVar105;
        auVar135._4_4_ = fVar232 * fVar141;
        auVar135._8_4_ = fVar234 * fVar156;
        auVar135._12_4_ = fVar237 * fVar157;
        auVar159 = vsubps_avx(auVar90,auVar116);
        auVar160 = vsubps_avx(auVar135,auVar67);
        auVar111 = vandps_avx(auVar116,auVar206);
        auVar112 = vandps_avx(auVar67,auVar206);
        auVar111 = vcmpps_avx(auVar111,auVar112,1);
        local_1948.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar160,auVar159,auVar111);
        local_1b28 = auVar24._0_4_;
        fStack_1b24 = auVar24._4_4_;
        fStack_1b20 = auVar24._8_4_;
        fVar75 = fVar199 * local_1948._0_4_ +
                 local_1948._32_4_ * local_1b28 + local_1a58 * local_1948._16_4_;
        fVar184 = fVar174 * local_1948._4_4_ +
                  local_1948._36_4_ * fStack_1b24 + fStack_1a54 * local_1948._20_4_;
        fVar77 = fVar212 * local_1948._8_4_ +
                 local_1948._40_4_ * fStack_1b20 + fStack_1a50 * local_1948._24_4_;
        fVar122 = fVar215 * local_1948._12_4_ +
                  local_1948._44_4_ * fVar76 + fStack_1a4c * local_1948._28_4_;
        auVar68._0_4_ = fVar75 + fVar75;
        auVar68._4_4_ = fVar184 + fVar184;
        auVar68._8_4_ = fVar77 + fVar77;
        auVar68._12_4_ = fVar122 + fVar122;
        fVar75 = local_1948._0_4_ * fVar158 +
                 local_1948._32_4_ * fVar228 + local_1948._16_4_ * fVar8;
        fVar184 = local_1948._4_4_ * fVar187 +
                  local_1948._36_4_ * fVar231 + local_1948._20_4_ * fVar9;
        fVar77 = local_1948._8_4_ * fVar194 +
                 local_1948._40_4_ * fVar233 + local_1948._24_4_ * fVar177;
        fVar122 = local_1948._12_4_ * fVar195 +
                  local_1948._44_4_ * fVar236 + local_1948._28_4_ * fVar10;
        auVar111 = vrcpps_avx(auVar68);
        fVar8 = auVar111._0_4_;
        auVar117._0_4_ = auVar68._0_4_ * fVar8;
        fVar9 = auVar111._4_4_;
        auVar117._4_4_ = auVar68._4_4_ * fVar9;
        fVar177 = auVar111._8_4_;
        auVar117._8_4_ = auVar68._8_4_ * fVar177;
        fVar10 = auVar111._12_4_;
        auVar117._12_4_ = auVar68._12_4_ * fVar10;
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar136,auVar117);
        local_1918._0_4_ = (fVar75 + fVar75) * (fVar8 + fVar8 * auVar111._0_4_);
        local_1918._4_4_ = (fVar184 + fVar184) * (fVar9 + fVar9 * auVar111._4_4_);
        local_1918._8_4_ = (fVar77 + fVar77) * (fVar177 + fVar177 * auVar111._8_4_);
        local_1918._12_4_ = (fVar122 + fVar122) * (fVar10 + fVar10 * auVar111._12_4_);
        auVar111 = vcmpps_avx(local_1918,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar112 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_1918,2);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar112 = vcmpps_avx(auVar68,ZEXT816(0) << 0x20,4);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar71 = vandps_avx(auVar106,auVar71);
        auVar111 = vpslld_avx(auVar111,0x1f);
        auVar112 = vpsrad_avx(auVar111,0x1f);
        auVar111 = auVar71 & auVar112;
        auVar73 = ZEXT1664(auVar106);
        if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar111[0xf]) {
          auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar71 = vandps_avx(auVar112,auVar71);
          uVar4 = *(uint *)(lVar36 + lVar42 * 4);
          pGVar6 = (context->scene->geometries).items[uVar4].ptr;
          uVar31 = pGVar6->mask;
          auVar91._4_4_ = uVar31;
          auVar91._0_4_ = uVar31;
          auVar91._8_4_ = uVar31;
          auVar91._12_4_ = uVar31;
          auVar111 = vandps_avx(auVar91,*(undefined1 (*) [16])(ray + 0x90));
          auVar111 = vpcmpeqd_avx(auVar111,ZEXT816(0) << 0x20);
          auVar112 = auVar71 & ~auVar111;
          auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar112[0xf] < '\0') {
            local_1a58 = *(float *)((long)&local_18b8 + lVar42 * 4);
            auVar71 = vandnps_avx(auVar111,auVar71);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar111 = vrcpps_avx(auVar131);
              fVar8 = auVar111._0_4_;
              auVar94._0_4_ = auVar131._0_4_ * fVar8;
              fVar9 = auVar111._4_4_;
              auVar94._4_4_ = auVar131._4_4_ * fVar9;
              fVar177 = auVar111._8_4_;
              auVar94._8_4_ = auVar131._8_4_ * fVar177;
              fVar10 = auVar111._12_4_;
              auVar94._12_4_ = auVar131._12_4_ * fVar10;
              auVar137._8_4_ = 0x3f800000;
              auVar137._0_8_ = 0x3f8000003f800000;
              auVar137._12_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar137,auVar94);
              auVar69._0_4_ = fVar8 + fVar8 * auVar111._0_4_;
              auVar69._4_4_ = fVar9 + fVar9 * auVar111._4_4_;
              auVar69._8_4_ = fVar177 + fVar177 * auVar111._8_4_;
              auVar69._12_4_ = fVar10 + fVar10 * auVar111._12_4_;
              auVar95._8_4_ = 0x219392ef;
              auVar95._0_8_ = 0x219392ef219392ef;
              auVar95._12_4_ = 0x219392ef;
              auVar100 = vcmpps_avx(auVar100,auVar95,5);
              auVar100 = vandps_avx(auVar100,auVar69);
              auVar96._0_4_ = auVar100._0_4_ * (float)local_1ad8._0_4_;
              auVar96._4_4_ = auVar100._4_4_ * (float)local_1ad8._4_4_;
              auVar96._8_4_ = auVar100._8_4_ * fStack_1ad0;
              auVar96._12_4_ = auVar100._12_4_ * fStack_1acc;
              auVar111 = vminps_avx(auVar96,auVar137);
              auVar70._0_4_ = auVar100._0_4_ * auVar193._0_4_;
              auVar70._4_4_ = auVar100._4_4_ * auVar193._4_4_;
              auVar70._8_4_ = auVar100._8_4_ * auVar193._8_4_;
              auVar70._12_4_ = auVar100._12_4_ * auVar193._12_4_;
              auVar100 = vminps_avx(auVar70,auVar137);
              auVar112 = vsubps_avx(auVar137,auVar111);
              auVar159 = vsubps_avx(auVar137,auVar100);
              auVar19._8_8_ = uVar29;
              auVar19._0_8_ = uVar28;
              local_18f8 = vblendvps_avx(auVar111,auVar112,auVar19);
              local_1908 = vblendvps_avx(auVar100,auVar159,auVar19);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              local_1a68 = auVar71;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_1948.field_0);
              local_18e8 = vpshufd_avx(ZEXT416(uVar4),0);
              local_18f8 = vshufps_avx(ZEXT416((uint)local_1a58),ZEXT416((uint)local_1a58),0);
              vcmpps_avx(ZEXT1632(local_18e8),ZEXT1632(local_18e8),0xf);
              uStack_18d4 = context->user->instID[0];
              local_18d8 = uStack_18d4;
              uStack_18d0 = uStack_18d4;
              uStack_18cc = uStack_18d4;
              uStack_18c8 = context->user->instPrimID[0];
              uStack_18c4 = uStack_18c8;
              uStack_18c0 = uStack_18c8;
              uStack_18bc = uStack_18c8;
              auVar100 = *(undefined1 (*) [16])(ray + 0x80);
              auVar71 = vblendvps_avx(auVar100,(undefined1  [16])t.field_0,local_1a68);
              *(undefined1 (*) [16])(ray + 0x80) = auVar71;
              local_1a88 = local_1a68;
              args.valid = (int *)local_1a88;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_1948;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar6->occlusionFilterN)(&args);
              }
              if (local_1a88 == (undefined1  [16])0x0) {
                auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar71 = auVar71 ^ _DAT_01f46b70;
                auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                p_Var7 = context->args->filter;
                if (p_Var7 == (RTCFilterFunctionN)0x0) {
                  auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                }
                else {
                  auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var7)(&args);
                    auVar223 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar207 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar219 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar111 = vpcmpeqd_avx(local_1a88,_DAT_01f45a50);
                auVar71 = auVar111 ^ _DAT_01f46b70;
                auVar98._8_4_ = 0xff800000;
                auVar98._0_8_ = 0xff800000ff800000;
                auVar98._12_4_ = 0xff800000;
                auVar111 = vblendvps_avx(auVar98,*(undefined1 (*) [16])(args.ray + 0x80),auVar111);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
              }
              auVar111 = vpslld_avx(auVar71,0x1f);
              auVar71 = vpsrad_avx(auVar111,0x1f);
              auVar100 = vblendvps_avx(auVar100,*(undefined1 (*) [16])local_1a70,auVar111);
              *(undefined1 (*) [16])local_1a70 = auVar100;
            }
            auVar100 = vpandn_avx(auVar71,auVar106);
            auVar73 = ZEXT1664(auVar100);
          }
        }
      }
      lVar42 = lVar42 + 1;
      auVar106 = auVar73._0_16_;
    } while ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar73[0xf] < '\0');
    auVar73 = ZEXT1664(local_1a38);
    auVar71 = vandps_avx(auVar106,local_1a38);
    lVar35 = lVar35 + 1;
    lVar36 = lVar36 + 0xe0;
    auVar106 = local_1a38 & auVar106;
    auVar100 = local_1a38;
    local_1a38 = auVar71;
  } while ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar106[0xf] < '\0');
  auVar100 = vpcmpeqd_avx(auVar100,auVar100);
  auVar53._0_4_ = local_1a38._0_4_ ^ auVar100._0_4_;
  auVar53._4_4_ = local_1a38._4_4_ ^ auVar100._4_4_;
  auVar53._8_4_ = local_1a38._8_4_ ^ auVar100._8_4_;
  auVar53._12_4_ = local_1a38._12_4_ ^ auVar100._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar53,(undefined1  [16])terminated.field_0);
  auVar100 = auVar100 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar100[0xf])
  goto LAB_00ec14e7;
  auVar73 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar99._8_4_ = 0xff800000;
  auVar99._0_8_ = 0xff800000ff800000;
  auVar99._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar99,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ebfee9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }